

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funzip.cpp
# Opt level: O2

void __thiscall FUnzip::smartDestDir(FUnzip *this,ZipStream *zs)

{
  string *__return_storage_ptr__;
  pointer pEVar1;
  bool bVar2;
  long lVar3;
  Entry *e;
  pointer name;
  undefined1 local_68 [8];
  string first;
  string n;
  
  if ((long)(zs->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(zs->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>.
            _M_impl.super__Vector_impl_data._M_start != 0x38) {
    __return_storage_ptr__ = (string *)(&first.field_2._M_allocated_capacity + 1);
    path_basename(__return_storage_ptr__,&this->zipName);
    std::__cxx11::string::operator=
              ((string *)&this->destinationDir,(string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               (zs->entries_).
               super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
               super__Vector_impl_data._M_start);
    lVar3 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2f);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)local_68,(ulong)((long)&first.field_2 + 8));
      name = (zs->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
      pEVar1 = (zs->entries_).
               super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (name == pEVar1) {
          std::__cxx11::string::assign((char *)&this->destinationDir);
          break;
        }
        bVar2 = startsWith(&name->name,(string *)local_68);
        name = name + 1;
      } while (bVar2);
      std::__cxx11::string::~string((string *)local_68);
    }
    std::__cxx11::string::~string((string *)(first.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void FUnzip::smartDestDir(ZipStream& zs)
{
    if (zs.size() == 1)
        return;

    destinationDir = path_basename(zipName);

    auto n = zs.getEntry(0).name;

    auto pos = n.find('/');
    if (pos == std::string::npos)
        return;
    std::string first = n.substr(0, pos);

    for (const auto& e : zs) {
        if (!startsWith(e.name, first))
            return;
    }
    destinationDir = "";
}